

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void kratos::extract_iter_var
               (Var *var,
               vector<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_> *iters)

{
  VarType VVar1;
  Expr *expr;
  IterVar *local_20;
  
  if (var != (Var *)0x0) {
    do {
      VVar1 = (((IterVar *)var)->super_Var).type_;
      if (VVar1 != Expression) {
        if (VVar1 != Iter) {
          return;
        }
        local_20 = (IterVar *)var;
        std::vector<kratos::IterVar_const*,std::allocator<kratos::IterVar_const*>>::
        emplace_back<kratos::IterVar_const*>
                  ((vector<kratos::IterVar_const*,std::allocator<kratos::IterVar_const*>> *)iters,
                   &local_20);
        return;
      }
      extract_iter_var((Var *)((IterVar *)var)->max_value_,iters);
      var = *(Var **)&((IterVar *)var)->is_gen_var_;
    } while ((IterVar *)var != (IterVar *)0x0);
  }
  return;
}

Assistant:

void extract_iter_var(const Var *var, std::vector<const IterVar *> &iters) {
    if (!var) return;
    if (var->type() == VarType::Iter) {
        iters.emplace_back(reinterpret_cast<const IterVar *>(var));
    } else if (var->type() == VarType::Expression) {
        auto const *expr = reinterpret_cast<const Expr *>(var);
        extract_iter_var(expr->left, iters);
        extract_iter_var(expr->right, iters);
    }
}